

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  param_type *in_RDI;
  fmtflags flags;
  double mu;
  param_type *this_00;
  param_type *this_01;
  double in_stack_ffffffffffffffc8;
  param_type *in_stack_ffffffffffffffd0;
  double local_18 [2];
  param_type *local_8;
  
  local_8 = in_RDI;
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)((long)&in_RDI->mu_ + *(long *)((long)in_RDI->mu_ + -0x18)));
  this_00 = (param_type *)((long)&local_8->mu_ + *(long *)((long)local_8->mu_ + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this_00,_Var2);
  this_01 = local_8;
  utility::delim('\0');
  this = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_01,
                             (delim_c *)this_00);
  std::istream::operator>>((istream *)this,local_18);
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this_01,(delim_c *)this_00);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&local_8->mu_ + *(long *)((long)local_8->mu_ + -0x18)));
  if (bVar1) {
    poisson_dist::param_type::param_type(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    poisson_dist::param_type::operator=(this_01,this_00);
    poisson_dist::param_type::~param_type((param_type *)0x3912cf);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)((long)&local_8->mu_ + *(long *)((long)local_8->mu_ + -0x18)),__fmtfl);
  return (basic_istream<char,_std::char_traits<char>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   poisson_dist::param_type &P) {
    double mu;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> mu >> utility::delim(')');
    if (in)
      P = poisson_dist::param_type(mu);
    in.flags(flags);
    return in;
  }